

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O2

void M3x3_ExtractEulerAngles_YZX(double (*matrix) [3],double *angles)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (*matrix)[0];
  if ((dVar1 != 9999999.0) || (NAN(dVar1))) {
    dVar3 = SQRT(dVar1 * dVar1 + matrix[2][0] * matrix[2][0]);
    dVar1 = atan2(matrix[1][0],dVar3);
    if (0.0001 <= dVar3) {
      dVar3 = atan2(-matrix[1][2],matrix[1][1]);
      dVar2 = atan2(-matrix[2][0],(*matrix)[0]);
      dVar2 = dVar2 * 57.29577951308232;
    }
    else {
      dVar3 = atan2(matrix[2][1],matrix[2][2]);
      dVar2 = 0.0;
    }
    *angles = dVar3 * 57.29577951308232;
    angles[1] = dVar2;
    dVar1 = dVar1 * 57.29577951308232;
  }
  else {
    *angles = 9999999.0;
    angles[1] = 9999999.0;
    dVar1 = 9999999.0;
  }
  angles[2] = dVar1;
  return;
}

Assistant:

void M3x3_ExtractEulerAngles_YZX(
  double matrix[3][3],
  double angles[3])
{
    double ax,ay,az;
    double cosZ;

/*
   R[YZX] = Ry * Rz * Rx

             | cy   0   sy |   | cz   -sz   0 |   | 1    0    0 |
          =  |  0   1    0 | * | sz    cz   0 | * | 0   cx  -sx |
             |-sy   0   cy |   |  0     0   1 |   | 0   sx   cx |


            | cycz    -cxcysz + sxsy    sxcysz + cxsy |
          = |   sz     cxcz            -sxcz          |
            |-sycz     cxsysz + sxcy   -sxsysz + cxcy |
*/

    if (matrix[0][0] == XEMPTY)
    {
        angles[0] = XEMPTY;
        angles[1] = XEMPTY;
        angles[2] = XEMPTY;
        return;
    }

    cosZ = sqrt(matrix[0][0]*matrix[0][0] + matrix[2][0]*matrix[2][0]);

    az = atan2(matrix[1][0], cosZ);

    if (cosZ < 0.0001)
    {
     // Gimble lock: set first angle to zero.
     // Assume sz=+-1,cz=0,sy=0,cy=1.0 and decode the matrix accordingly

        ax = atan2(matrix[2][1], matrix[2][2]);
        ay = 0.0;
    }
    else
    {
        ax = atan2(-matrix[1][2], matrix[1][1]);
        ay = atan2(-matrix[2][0], matrix[0][0]);
    }

    angles[0] = ax * (180.0/M_PI);
    angles[1] = ay * (180.0/M_PI);
    angles[2] = az * (180.0/M_PI);
}